

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O2

JsErrorCode
JsSetObjectBeforeCollectCallback
          (JsRef ref,void *callbackState,JsObjectBeforeCollectCallback objectBeforeCollectCallback)

{
  Recycler *this;
  bool bVar1;
  BOOL BVar2;
  ThreadContext *threadContext;
  JsErrorCode JVar3;
  AutoNestedHandledExceptionType local_58 [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  JVar3 = JsErrorInvalidArgument;
  if (ref != (JsRef)0x0) {
    bVar1 = Js::TaggedNumber::Is(ref);
    if (!bVar1) {
      bVar1 = JsrtContext::Is(ref);
      if (bVar1) {
        AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
                  (local_58,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
        Memory::Recycler::SetObjectBeforeCollectCallback
                  (*(Recycler **)((long)**(undefined8 **)((long)ref + 0x10) + 0x588),ref,
                   (ObjectBeforeCollectCallback)objectBeforeCollectCallback,callbackState,
                   JsrtCallbackState::ObjectBeforeCallectCallbackWrapper,
                   (void *)**(undefined8 **)((long)ref + 0x10));
        AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_58);
        JVar3 = JsNoError;
      }
      else {
        threadContext = ThreadContext::GetContextForCurrentThread();
        if (threadContext == (ThreadContext *)0x0) {
          JVar3 = JsErrorNoCurrentContext;
        }
        else {
          this = threadContext->recycler;
          AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
                    (local_58,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
          BVar2 = Memory::Recycler::IsValidObject(this,ref,0);
          if (BVar2 == 0) {
            JVar3 = JsErrorInvalidArgument;
          }
          else {
            JVar3 = JsNoError;
            Memory::Recycler::SetObjectBeforeCollectCallback
                      (this,ref,(ObjectBeforeCollectCallback)objectBeforeCollectCallback,
                       callbackState,JsrtCallbackState::ObjectBeforeCallectCallbackWrapper,
                       threadContext);
          }
          AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_58);
        }
      }
    }
  }
  return JVar3;
}

Assistant:

CHAKRA_API JsSetObjectBeforeCollectCallback(_In_ JsRef ref, _In_opt_ void *callbackState, _In_ JsObjectBeforeCollectCallback objectBeforeCollectCallback)
{
    VALIDATE_JSREF(ref);

    if (Js::TaggedNumber::Is(ref))
    {
        return JsErrorInvalidArgument;
    }

    if (JsrtContext::Is(ref))
    {
        return GlobalAPIWrapper_NoRecord([&]() -> JsErrorCode
        {
            ThreadContext* threadContext = static_cast<JsrtContext *>(ref)->GetRuntime()->GetThreadContext();
            Recycler * recycler = threadContext->GetRecycler();
            recycler->SetObjectBeforeCollectCallback(ref, reinterpret_cast<Recycler::ObjectBeforeCollectCallback>(objectBeforeCollectCallback), callbackState,
                reinterpret_cast<Recycler::ObjectBeforeCollectCallbackWrapper>(JsrtCallbackState::ObjectBeforeCallectCallbackWrapper), threadContext);
            return JsNoError;
        });
    }
    else
    {
        ThreadContext* threadContext = ThreadContext::GetContextForCurrentThread();
        if (threadContext == nullptr)
        {
            return JsErrorNoCurrentContext;
        }
        Recycler * recycler = threadContext->GetRecycler();
        return GlobalAPIWrapper_NoRecord([&]() -> JsErrorCode
        {
            if (!recycler->IsValidObject(ref))
            {
                return JsErrorInvalidArgument;
            }

            recycler->SetObjectBeforeCollectCallback(ref, reinterpret_cast<Recycler::ObjectBeforeCollectCallback>(objectBeforeCollectCallback), callbackState,
                reinterpret_cast<Recycler::ObjectBeforeCollectCallbackWrapper>(JsrtCallbackState::ObjectBeforeCallectCallbackWrapper), threadContext);
            return JsNoError;
        });
    }
}